

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O0

void __thiscall
rsg::ProgramExecutor::execute
          (ProgramExecutor *this,Shader *vertexShader,Shader *fragmentShader,
          vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *uniformValues)

{
  ShaderInput *this_00;
  ConstValueRangeAccess valueRange;
  bool bVar1;
  int gridVtxHeight_00;
  uint numVertices_00;
  int iVar2;
  deBool dVar3;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *pvVar6;
  reference ppSVar7;
  Variable *pVVar8;
  reference ppVVar9;
  char *pcVar10;
  int iVar4;
  int iVar5;
  int x_00;
  VariableType *pVVar11;
  VaryingStorage *pVVar12;
  pointer pVVar13;
  TestError *this_01;
  int *piVar14;
  float *pfVar15;
  int gridVtxWidth_00;
  uint uVar16;
  float cellWidth_00;
  float cellHeight_00;
  float fVar17;
  float y_;
  float z_;
  float w_;
  ConstStridedValueAccess<64> CVar18;
  ValueAccess dst_00;
  StridedValueRead<1> SVar19;
  ExecValueAccess dst_01;
  ConstValueAccess CVar20;
  ConstValueAccess vtx1;
  ConstValueAccess vtx2;
  ConstValueAccess vtx3;
  ConstStridedValueAccess<64> CVar21;
  ConstStridedValueAccess<64> local_490;
  ConstStridedValueAccess<64> local_480;
  ConstStridedValueAccess<64> local_470;
  ConstStridedValueAccess<64> local_460;
  undefined1 local_450 [8];
  Vec4 c;
  int cNdx;
  int x_2;
  int y_2;
  int fragNdx_1;
  undefined1 local_420 [8];
  ExecConstValueAccess colorValue;
  Vector<float,_2> local_3b4;
  Vec2 weights;
  IVec4 vtxIndices;
  int x_1;
  int y_1;
  int fragNdx;
  VaryingStorage *src;
  VariableType *type;
  ExecValueAccess access_2;
  ShaderInput *input_1;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_360;
  const_iterator i_4;
  int packetEnd_1;
  int packetStart_1;
  int packetNdx_1;
  float cellHeight;
  float cellWidth;
  int numPackets_1;
  int height;
  int width;
  __normal_iterator<const_rsg::Variable_**,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
  local_330;
  __normal_iterator<const_rsg::Variable_**,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
  local_328;
  __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
  local_320;
  const_iterator i_3;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> outputs_1;
  Variable *fragColorVar;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *inputs_1;
  ConstStridedValueAccess<64> local_2e8;
  ConstValueAccess local_2d8;
  StridedValueRead<1> local_2c8;
  __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_2b8;
  __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_2b0;
  const_iterator i_2;
  ExecutionContext execCtx_1;
  ValueAccess varyingAccess;
  int vtxNdx_1;
  VaryingStorage *dst;
  ExecConstValueAccess access_1;
  Variable *output;
  __normal_iterator<const_rsg::Variable_**,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
  local_1d8;
  __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
  local_1d0;
  const_iterator i_1;
  ConstValueRangeAccess local_1c0;
  ConstStridedValueAccess<64> local_1a8;
  float local_18c;
  float local_188;
  float yf;
  float xf;
  int x;
  int y;
  int vtxNdx;
  ExecValueAccess access;
  ShaderInput *input;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_158;
  const_iterator i;
  int packetEnd;
  int packetStart;
  int packetNdx;
  ConstStridedValueAccess<64> local_138;
  ConstValueAccess local_128;
  StridedValueRead<1> local_118;
  __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_108;
  __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
  local_100;
  const_iterator uniformIter;
  vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> outputs;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *inputs;
  int numPackets;
  undefined1 local_c8 [8];
  ExecutionContext execCtx;
  VaryingStore varyingStore;
  int numVertices;
  int gridVtxHeight;
  int gridVtxWidth;
  vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *uniformValues_local;
  Shader *fragmentShader_local;
  Shader *vertexShader_local;
  ProgramExecutor *this_local;
  
  iVar4 = this->m_gridWidth;
  gridVtxWidth_00 = iVar4 + 1;
  iVar5 = this->m_gridHeight;
  gridVtxHeight_00 = iVar5 + 1;
  numVertices_00 = gridVtxWidth_00 * gridVtxHeight_00;
  VaryingStore::VaryingStore
            ((VaryingStore *)
             &execCtx.m_execMaskStack.
              super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,numVertices_00);
  ExecutionContext::ExecutionContext
            ((ExecutionContext *)local_c8,&this->m_samplers2D,&this->m_samplersCube);
  uVar16 = numVertices_00;
  if ((int)numVertices_00 < 0) {
    uVar16 = numVertices_00 + 0x3f;
  }
  pvVar6 = rsg::Shader::getInputs(vertexShader);
  std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::vector
            ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)&uniformIter);
  rsg::Shader::getOutputs
            (vertexShader,
             (vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)&uniformIter);
  local_100._M_current =
       (VariableValue *)
       std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::begin(uniformValues);
  while( true ) {
    local_108._M_current =
         (VariableValue *)
         std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::end(uniformValues);
    bVar1 = __gnu_cxx::operator!=(&local_100,&local_108);
    if (!bVar1) break;
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
              ::operator->(&local_100);
    CVar20 = VariableValue::getValue(pVVar13);
    local_128 = CVar20;
    SVar19 = ConstStridedValueAccess<1>::value(&local_128);
    local_118 = SVar19;
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
              ::operator->(&local_100);
    pVVar8 = VariableValue::getVariable(pVVar13);
    CVar18 = (ConstStridedValueAccess<64>)
             ExecutionContext::getValue((ExecutionContext *)local_c8,pVVar8);
    local_138 = CVar18;
    StridedValueAccess<64>::operator=((StridedValueAccess<64> *)&local_138,&local_118);
    __gnu_cxx::
    __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
    ::operator++(&local_100,0);
  }
  for (packetEnd = 0; packetEnd < (int)(numVertices_00 + (numVertices_00 != (uVar16 & 0xffffffc0)));
      packetEnd = packetEnd + 1) {
    i._M_current._4_4_ = ::deMin32(packetEnd * 0x40 + 0x40,numVertices_00);
    local_158._M_current =
         (ShaderInput **)
         std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin(pvVar6);
    while( true ) {
      input = (ShaderInput *)
              std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end(pvVar6);
      bVar1 = __gnu_cxx::operator!=
                        (&local_158,
                         (__normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                          *)&input);
      if (!bVar1) break;
      ppSVar7 = __gnu_cxx::
                __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                ::operator*(&local_158);
      access.super_ConstStridedValueAccess<64>.m_value = (Scalar *)*ppSVar7;
      pVVar8 = ShaderInput::getVariable
                         ((ShaderInput *)access.super_ConstStridedValueAccess<64>.m_value);
      CVar18 = (ConstStridedValueAccess<64>)
               ExecutionContext::getValue((ExecutionContext *)local_c8,pVVar8);
      x = packetEnd * 0x40;
      while( true ) {
        access.super_ConstStridedValueAccess<64>.m_type = (VariableType *)CVar18.m_value;
        _y = CVar18.m_type;
        if (i._M_current._4_4_ <= x) break;
        xf = (float)(x / gridVtxWidth_00);
        yf = (float)(x - (int)xf * gridVtxWidth_00);
        local_188 = (float)(int)yf / (float)iVar4;
        local_18c = (float)(int)xf / (float)iVar5;
        iVar2 = x + packetEnd * -0x40;
        local_1a8 = CVar18;
        ShaderInput::getValueRange
                  (&local_1c0,(ShaderInput *)access.super_ConstStridedValueAccess<64>.m_value);
        valueRange.m_min = local_1c0.m_min;
        valueRange.m_type = local_1c0.m_type;
        valueRange.m_max = local_1c0.m_max;
        interpolateVertexInput<64>
                  ((StridedValueAccess<64>)local_1a8,iVar2,valueRange,local_188,local_18c);
        CVar18.m_value = (Scalar *)access.super_ConstStridedValueAccess<64>.m_type;
        CVar18.m_type = _y;
        x = x + 1;
      }
      i_1._M_current =
           (Variable **)
           __gnu_cxx::
           __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
           ::operator++(&local_158,0);
    }
    rsg::Shader::execute(vertexShader,(ExecutionContext *)local_c8);
    local_1d8._M_current =
         (Variable **)
         std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::begin
                   ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)
                    &uniformIter);
    __gnu_cxx::
    __normal_iterator<rsg::Variable_const*const*,std::vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>>>
    ::__normal_iterator<rsg::Variable_const**>
              ((__normal_iterator<rsg::Variable_const*const*,std::vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>>>
                *)&local_1d0,&local_1d8);
    while( true ) {
      output = (Variable *)
               std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::end
                         ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)
                          &uniformIter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1d0,
                         (__normal_iterator<const_rsg::Variable_**,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
                          *)&output);
      if (!bVar1) break;
      ppVVar9 = __gnu_cxx::
                __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
                ::operator*(&local_1d0);
      pVVar8 = *ppVVar9;
      pcVar10 = rsg::Variable::getName(pVVar8);
      dVar3 = deStringEqual(pcVar10,"gl_Position");
      if (dVar3 == 0) {
        CVar18 = (ConstStridedValueAccess<64>)
                 ExecutionContext::getValue((ExecutionContext *)local_c8,pVVar8);
        pVVar11 = rsg::Variable::getType(pVVar8);
        pcVar10 = rsg::Variable::getName(pVVar8);
        pVVar12 = VaryingStore::getStorage
                            ((VaryingStore *)
                             &execCtx.m_execMaskStack.
                              super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar11,pcVar10);
        for (varyingAccess.super_ConstStridedValueAccess<1>.m_value._4_4_ = packetEnd * 0x40;
            varyingAccess.super_ConstStridedValueAccess<1>.m_value._4_4_ < i._M_current._4_4_;
            varyingAccess.super_ConstStridedValueAccess<1>.m_value._4_4_ =
                 varyingAccess.super_ConstStridedValueAccess<1>.m_value._4_4_ + 1) {
          pVVar11 = rsg::Variable::getType(pVVar8);
          dst_00 = VaryingStorage::getValue
                             (pVVar12,pVVar11,
                              varyingAccess.super_ConstStridedValueAccess<1>.m_value._4_4_);
          copyVarying<64>(dst_00,CVar18,
                          varyingAccess.super_ConstStridedValueAccess<1>.m_value._4_4_ +
                          packetEnd * -0x40);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
      ::operator++(&local_1d0,0);
    }
  }
  std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::~vector
            ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)&uniformIter);
  ExecutionContext::~ExecutionContext((ExecutionContext *)local_c8);
  ExecutionContext::ExecutionContext
            ((ExecutionContext *)&i_2,&this->m_samplers2D,&this->m_samplersCube);
  local_2b0._M_current =
       (VariableValue *)
       std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::begin(uniformValues);
  while( true ) {
    local_2b8._M_current =
         (VariableValue *)
         std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::end(uniformValues);
    bVar1 = __gnu_cxx::operator!=(&local_2b0,&local_2b8);
    if (!bVar1) break;
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
              ::operator->(&local_2b0);
    CVar20 = VariableValue::getValue(pVVar13);
    local_2d8 = CVar20;
    SVar19 = ConstStridedValueAccess<1>::value(&local_2d8);
    local_2c8 = SVar19;
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
              ::operator->(&local_2b0);
    pVVar8 = VariableValue::getVariable(pVVar13);
    CVar18 = (ConstStridedValueAccess<64>)
             ExecutionContext::getValue((ExecutionContext *)&i_2,pVVar8);
    local_2e8 = CVar18;
    StridedValueAccess<64>::operator=((StridedValueAccess<64> *)&local_2e8,&local_2c8);
    __gnu_cxx::
    __normal_iterator<const_rsg::VariableValue_*,_std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>_>
    ::operator++(&local_2b0,0);
  }
  pvVar6 = rsg::Shader::getInputs(fragmentShader);
  outputs_1.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::vector
            ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)&i_3);
  rsg::Shader::getOutputs
            (fragmentShader,
             (vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)&i_3);
  local_328._M_current =
       (Variable **)
       std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::begin
                 ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)&i_3);
  __gnu_cxx::
  __normal_iterator<rsg::Variable_const*const*,std::vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>>>
  ::__normal_iterator<rsg::Variable_const**>
            ((__normal_iterator<rsg::Variable_const*const*,std::vector<rsg::Variable_const*,std::allocator<rsg::Variable_const*>>>
              *)&local_320,&local_328);
  do {
    local_330._M_current =
         (Variable **)
         std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::end
                   ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)&i_3);
    bVar1 = __gnu_cxx::operator!=(&local_320,&local_330);
    if (!bVar1) {
LAB_028a2d7e:
      while( true ) {
        dVar3 = ::deGetFalse();
        if ((dVar3 != 0) ||
           (outputs_1.
            super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0)) break;
        dVar3 = ::deGetFalse();
        if (dVar3 == 0) {
          iVar4 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)this);
          iVar5 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)this);
          CVar21.m_value = (Scalar *)colorValue.m_type;
          CVar21.m_type = (VariableType *)local_420;
          cellWidth_00 = (float)iVar4 / (float)this->m_gridWidth;
          cellHeight_00 = (float)iVar5 / (float)this->m_gridHeight;
          packetEnd_1 = 0;
          while( true ) {
            colorValue.m_type = (VariableType *)CVar21.m_value;
            local_420 = (undefined1  [8])CVar21.m_type;
            if ((int)((iVar4 * iVar5) / 0x40 + (uint)((iVar4 * iVar5) % 0x40 != 0)) <= packetEnd_1)
            break;
            i_4._M_current._4_4_ = packetEnd_1 << 6;
            i_4._M_current._0_4_ = ::deMin32(packetEnd_1 * 0x40 + 0x40,iVar4 * iVar5);
            local_360._M_current =
                 (ShaderInput **)
                 std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin(pvVar6)
            ;
            while( true ) {
              input_1 = (ShaderInput *)
                        std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end
                                  (pvVar6);
              bVar1 = __gnu_cxx::operator!=
                                (&local_360,
                                 (__normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                                  *)&input_1);
              if (!bVar1) break;
              ppSVar7 = __gnu_cxx::
                        __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                        ::operator*(&local_360);
              this_00 = *ppSVar7;
              pVVar8 = ShaderInput::getVariable(this_00);
              dst_01 = ExecutionContext::getValue((ExecutionContext *)&i_2,pVVar8);
              pVVar8 = ShaderInput::getVariable(this_00);
              pVVar11 = rsg::Variable::getType(pVVar8);
              pVVar8 = ShaderInput::getVariable(this_00);
              pcVar10 = rsg::Variable::getName(pVVar8);
              pVVar12 = VaryingStore::getStorage
                                  ((VaryingStore *)
                                   &execCtx.m_execMaskStack.
                                    super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar11,
                                   pcVar10);
              for (x_1 = i_4._M_current._4_4_; x_1 < (int)i_4._M_current; x_1 = x_1 + 1) {
                iVar2 = x_1 / iVar4;
                x_00 = x_1 - iVar2 * iVar4;
                computeVertexIndices
                          ((rsg *)&weights,cellWidth_00,cellHeight_00,gridVtxWidth_00,
                           gridVtxHeight_00,x_00,iVar2);
                computeGridCellWeights((rsg *)&local_3b4,cellWidth_00,cellHeight_00,x_00,iVar2);
                iVar2 = x_1 - i_4._M_current._4_4_;
                piVar14 = tcu::Vector<int,_4>::x((Vector<int,_4> *)&weights);
                CVar20 = VaryingStorage::getValue(pVVar12,pVVar11,*piVar14);
                piVar14 = tcu::Vector<int,_4>::y((Vector<int,_4> *)&weights);
                vtx1 = VaryingStorage::getValue(pVVar12,pVVar11,*piVar14);
                piVar14 = tcu::Vector<int,_4>::z((Vector<int,_4> *)&weights);
                vtx2 = VaryingStorage::getValue(pVVar12,pVVar11,*piVar14);
                piVar14 = tcu::Vector<int,_4>::w((Vector<int,_4> *)&weights);
                vtx3 = VaryingStorage::getValue(pVVar12,pVVar11,*piVar14);
                pfVar15 = tcu::Vector<float,_2>::x(&local_3b4);
                fVar17 = *pfVar15;
                pfVar15 = tcu::Vector<float,_2>::y(&local_3b4);
                interpolateFragmentInput<64>
                          ((StridedValueAccess<64>)dst_01.super_ConstStridedValueAccess<64>,iVar2,
                           CVar20,vtx1,vtx2,vtx3,fVar17,*pfVar15);
              }
              colorValue.m_value =
                   (Scalar *)
                   __gnu_cxx::
                   __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                   ::operator++(&local_360,0);
            }
            rsg::Shader::execute(fragmentShader,(ExecutionContext *)&i_2);
            CVar21 = (ConstStridedValueAccess<64>)
                     ExecutionContext::getValue
                               ((ExecutionContext *)&i_2,
                                (Variable *)
                                outputs_1.
                                super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            x_2 = i_4._M_current._4_4_;
            while( true ) {
              colorValue.m_type = (VariableType *)CVar21.m_value;
              local_420 = (undefined1  [8])CVar21.m_type;
              if ((int)i_4._M_current <= x_2) break;
              c.m_data[3] = (float)(x_2 - (x_2 / iVar4) * iVar4);
              c.m_data[2] = (float)(x_2 - i_4._M_current._4_4_);
              CVar18 = ConstStridedValueAccess<64>::component
                                 ((ConstStridedValueAccess<64> *)local_420,0);
              local_460 = CVar18;
              fVar17 = ConstStridedValueAccess<64>::asFloat(&local_460,(int)c.m_data[2]);
              CVar18 = ConstStridedValueAccess<64>::component
                                 ((ConstStridedValueAccess<64> *)local_420,1);
              local_470 = CVar18;
              y_ = ConstStridedValueAccess<64>::asFloat(&local_470,(int)c.m_data[2]);
              CVar18 = ConstStridedValueAccess<64>::component
                                 ((ConstStridedValueAccess<64> *)local_420,2);
              local_480 = CVar18;
              z_ = ConstStridedValueAccess<64>::asFloat(&local_480,(int)c.m_data[2]);
              CVar18 = ConstStridedValueAccess<64>::component
                                 ((ConstStridedValueAccess<64> *)local_420,3);
              local_490 = CVar18;
              w_ = ConstStridedValueAccess<64>::asFloat(&local_490,(int)c.m_data[2]);
              tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_450,fVar17,y_,z_,w_);
              fVar17 = c.m_data[3];
              iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)this);
              tcu::PixelBufferAccess::setPixel
                        (&this->m_dst,(Vec4 *)local_450,(int)fVar17,~(x_2 / iVar4) + iVar2,0);
              CVar21.m_value = (Scalar *)colorValue.m_type;
              CVar21.m_type = (VariableType *)local_420;
              x_2 = x_2 + 1;
            }
            packetEnd_1 = packetEnd_1 + 1;
          }
          std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::~vector
                    ((vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)&i_3);
          ExecutionContext::~ExecutionContext((ExecutionContext *)&i_2);
          VaryingStore::~VaryingStore
                    ((VaryingStore *)
                     &execCtx.m_execMaskStack.
                      super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          return;
        }
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"fragColorVar",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
                 ,299);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    ppVVar9 = __gnu_cxx::
              __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
              ::operator*(&local_320);
    iVar4 = rsg::Variable::getLayoutLocation(*ppVVar9);
    if (iVar4 == 0) {
      ppVVar9 = __gnu_cxx::
                __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
                ::operator*(&local_320);
      outputs_1.super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppVVar9;
      goto LAB_028a2d7e;
    }
    __gnu_cxx::
    __normal_iterator<const_rsg::Variable_*const_*,_std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>_>
    ::operator++(&local_320,0);
  } while( true );
}

Assistant:

void ProgramExecutor::execute (const Shader& vertexShader, const Shader& fragmentShader, const vector<VariableValue>& uniformValues)
{
	int	gridVtxWidth	= m_gridWidth+1;
	int gridVtxHeight	= m_gridHeight+1;
	int numVertices		= gridVtxWidth*gridVtxHeight;

	VaryingStore varyingStore(numVertices);

	// Execute vertex shader
	{
		ExecutionContext	execCtx(m_samplers2D, m_samplersCube);
		int					numPackets	= numVertices + ((numVertices%EXEC_VEC_WIDTH) ? 1 : 0);

		const vector<ShaderInput*>& inputs	= vertexShader.getInputs();
		vector<const Variable*>		outputs;
		vertexShader.getOutputs(outputs);

		// Set uniform values
		for (vector<VariableValue>::const_iterator uniformIter = uniformValues.begin(); uniformIter != uniformValues.end(); uniformIter++)
			execCtx.getValue(uniformIter->getVariable()) = uniformIter->getValue().value();

		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			int packetStart	= packetNdx*EXEC_VEC_WIDTH;
			int packetEnd	= deMin32((packetNdx+1)*EXEC_VEC_WIDTH, numVertices);

			// Compute values for vertex shader inputs
			for (vector<ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
			{
				const ShaderInput*	input	= *i;
				ExecValueAccess		access	= execCtx.getValue(input->getVariable());

				for (int vtxNdx = packetStart; vtxNdx < packetEnd; vtxNdx++)
				{
					int		y	= (vtxNdx/gridVtxWidth);
					int		x	= vtxNdx - y*gridVtxWidth;
					float	xf	= (float)x / (float)(gridVtxWidth-1);
					float	yf	= (float)y / (float)(gridVtxHeight-1);

					interpolateVertexInput(access, vtxNdx-packetStart, input->getValueRange(), xf, yf);
				}
			}

			// Execute vertex shader for packet
			vertexShader.execute(execCtx);

			// Store output values
			for (vector<const Variable*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
			{
				const Variable*			output	= *i;

				if (deStringEqual(output->getName(), "gl_Position"))
					continue; // Do not store position

				ExecConstValueAccess	access	= execCtx.getValue(output);
				VaryingStorage*			dst		= varyingStore.getStorage(output->getType(), output->getName());

				for (int vtxNdx = packetStart; vtxNdx < packetEnd; vtxNdx++)
				{
					ValueAccess varyingAccess = dst->getValue(output->getType(), vtxNdx);
					copyVarying(varyingAccess, access, vtxNdx-packetStart);
				}
			}
		}
	}

	// Execute fragment shader
	{
		ExecutionContext execCtx(m_samplers2D, m_samplersCube);

		// Assign uniform values
		for (vector<VariableValue>::const_iterator i = uniformValues.begin(); i != uniformValues.end(); i++)
			execCtx.getValue(i->getVariable()) = i->getValue().value();

		const vector<ShaderInput*>& inputs			= fragmentShader.getInputs();
		const Variable*				fragColorVar	= DE_NULL;
		vector<const Variable*>		outputs;

		// Find fragment shader output assigned to location 0. This is fragment color.
		fragmentShader.getOutputs(outputs);
		for (vector<const Variable*>::const_iterator i = outputs.begin(); i != outputs.end(); i++)
		{
			if ((*i)->getLayoutLocation() == 0)
			{
				fragColorVar = *i;
				break;
			}
		}
		TCU_CHECK(fragColorVar);

		int	width		= m_dst.getWidth();
		int height		= m_dst.getHeight();
		int numPackets	= (width*height)/EXEC_VEC_WIDTH + (((width*height)%EXEC_VEC_WIDTH) ? 1 : 0);

		float cellWidth		= (float)width	/ (float)m_gridWidth;
		float cellHeight	= (float)height	/ (float)m_gridHeight;

		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			int packetStart	= packetNdx*EXEC_VEC_WIDTH;
			int packetEnd	= deMin32((packetNdx+1)*EXEC_VEC_WIDTH, width*height);

			// Interpolate varyings
			for (vector<ShaderInput*>::const_iterator i = inputs.begin(); i != inputs.end(); i++)
			{
				const ShaderInput*		input	= *i;
				ExecValueAccess			access	= execCtx.getValue(input->getVariable());
				const VariableType&		type	= input->getVariable()->getType();
				const VaryingStorage*	src		= varyingStore.getStorage(type, input->getVariable()->getName());

				// \todo [2011-03-08 pyry] Part of this could be pre-computed...
				for (int fragNdx = packetStart; fragNdx < packetEnd; fragNdx++)
				{
					int y = fragNdx/width;
					int x = fragNdx - y*width;
					tcu::IVec4	vtxIndices	= computeVertexIndices(cellWidth, cellHeight, gridVtxWidth, gridVtxHeight, x, y);
					tcu::Vec2	weights		= computeGridCellWeights(cellWidth, cellHeight, x, y);

					interpolateFragmentInput(access, fragNdx-packetStart,
											 src->getValue(type, vtxIndices.x()),
											 src->getValue(type, vtxIndices.y()),
											 src->getValue(type, vtxIndices.z()),
											 src->getValue(type, vtxIndices.w()),
											 weights.x(), weights.y());
				}
			}

			// Execute fragment shader
			fragmentShader.execute(execCtx);

			// Write resulting color
			ExecConstValueAccess colorValue = execCtx.getValue(fragColorVar);
			for (int fragNdx = packetStart; fragNdx < packetEnd; fragNdx++)
			{
				int			y		= fragNdx/width;
				int			x		= fragNdx - y*width;
				int			cNdx	= fragNdx-packetStart;
				tcu::Vec4	c		= tcu::Vec4(colorValue.component(0).asFloat(cNdx),
												colorValue.component(1).asFloat(cNdx),
												colorValue.component(2).asFloat(cNdx),
												colorValue.component(3).asFloat(cNdx));

				// \todo [2012-11-13 pyry] Reverse order.
				m_dst.setPixel(c, x, m_dst.getHeight()-y-1);
			}
		}
	}
}